

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *pcVar1;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  string dir;
  
  pcVar1 = FindLastPathSeparator(this);
  local_38 = (undefined1  [8])&dir._M_string_length;
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length._0_1_ = 0;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::assign(local_38);
  }
  else {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,(this->pathname_)._M_dataplus._M_p,pcVar1 + 1);
    std::__cxx11::string::operator=((string *)local_38,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  FilePath(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), static_cast<size_t>(last_sep + 1 - c_str()));
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}